

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int io_seek(IOHANDLE io,int offset,int origin)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  FILE *in_RDI;
  int real_origin;
  int local_1c;
  
  if (in_EDX == 0) {
    local_1c = 0;
  }
  else if (in_EDX == 1) {
    local_1c = 1;
  }
  else {
    if (in_EDX != 2) {
      return -1;
    }
    local_1c = 2;
  }
  iVar1 = fseek(in_RDI,(long)in_ESI,local_1c);
  return iVar1;
}

Assistant:

int io_seek(IOHANDLE io, int offset, int origin)
{
	int real_origin;

	switch(origin)
	{
	case IOSEEK_START:
		real_origin = SEEK_SET;
		break;
	case IOSEEK_CUR:
		real_origin = SEEK_CUR;
		break;
	case IOSEEK_END:
		real_origin = SEEK_END;
		break;
	default:
		return -1;
	}

	return fseek((FILE*)io, offset, real_origin);
}